

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::CCPPass::Process(CCPPass *this)

{
  bool bVar1;
  ProcessFunction pfn;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  Initialize(this);
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ccp_pass.cpp:370:25)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ccp_pass.cpp:370:25)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  bVar1 = IRContext::ProcessReachableCallTree
                    ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return bVar1 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status CCPPass::Process() {
  Initialize();

  // Process all entry point functions.
  ProcessFunction pfn = [this](Function* fp) { return PropagateConstants(fp); };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}